

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O0

string * __thiscall
grpc_java_generator::(anonymous_namespace)::MethodPropertiesGetterName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,MethodDescriptor *method)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  _anonymous_namespace_ *local_18;
  MethodDescriptor *method_local;
  
  local_18 = this;
  method_local = (MethodDescriptor *)__return_storage_ptr__;
  (**(code **)(*(long *)this + 0x28))();
  std::operator+(&local_58,"get_",&local_78);
  std::operator+(&local_38,&local_58,"_method");
  anon_unknown_0::MixedLower(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

static inline string MethodPropertiesGetterName(
    const MethodDescriptor *method) {
  return MixedLower("get_" + method->name() + "_method");
}